

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::AddSpaceUsed(SerialArena *this,size_t space_used)

{
  __int_type_conflict _Var1;
  size_t space_used_local;
  SerialArena *this_local;
  memory_order __b;
  memory_order __b_1;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->space_used_).super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->space_used_).super___atomic_base<unsigned_long>._M_i = _Var1 + space_used;
  return;
}

Assistant:

void AddSpaceUsed(size_t space_used) {
    space_used_.store(space_used_.load(std::memory_order_relaxed) + space_used,
                      std::memory_order_relaxed);
  }